

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O2

void __thiscall
icu_63::MaybeStackArray<char,_30>::MaybeStackArray
          (MaybeStackArray<char,_30> *this,int32_t newCapacity)

{
  this->ptr = this->stackArray;
  this->capacity = 0x1e;
  this->needToRelease = '\0';
  if (0x1e < newCapacity) {
    resize(this,newCapacity,0);
  }
  return;
}

Assistant:

MaybeStackArray() : ptr(stackArray), capacity(stackCapacity), needToRelease(FALSE) {}